

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcProve.c
# Opt level: O3

int Abc_NtkMiterProve(Abc_Ntk_t **ppNtk,void *pPars)

{
  int iVar1;
  long *plVar2;
  DdNode *pDVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  Abc_Ntk_t *pAVar7;
  Fraig_Man_t *p;
  Abc_Ntk_t *pNtk;
  int *piVar8;
  int *__dest;
  DdNode *pDVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  abctime aVar13;
  ABC_INT64_T AVar14;
  int iVar15;
  size_t sVar16;
  double dVar17;
  double dVar18;
  ABC_INT64_T nSatInspects;
  ABC_INT64_T nSatConfs;
  timespec ts;
  abctime local_98;
  long local_90;
  long local_88;
  Fraig_Params_t local_80;
  Abc_Ntk_t **local_40;
  double local_38;
  
  pNtk = *ppNtk;
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcProve.c"
                  ,0x48,"int Abc_NtkMiterProve(Abc_Ntk_t **, void *)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcProve.c"
                  ,0x49,"int Abc_NtkMiterProve(Abc_Ntk_t **, void *)");
  }
  if (*(int *)((long)pPars + 0xc) != 0) {
    pcVar10 = "yes";
    pcVar11 = "yes";
    if (*(int *)((long)pPars + 4) == 0) {
      pcVar11 = "no";
    }
    if (*pPars == 0) {
      pcVar10 = "no";
    }
    printf("RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
           (ulong)*(uint *)((long)pPars + 0x10),pcVar11,pcVar10);
    printf("Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n",
           (double)*(float *)((long)pPars + 0x18),(double)*(float *)((long)pPars + 0x20),
           (double)*(float *)((long)pPars + 0x28),(ulong)*(uint *)((long)pPars + 0x14),
           (ulong)*(uint *)((long)pPars + 0x1c));
  }
  local_40 = ppNtk;
  if ((*(int *)((long)pPars + 4) == 0) && (*pPars == 0)) {
    iVar15 = clock_gettime(3,(timespec *)&local_80);
    if (iVar15 < 0) {
      aVar13 = -1;
    }
    else {
      aVar13 = CONCAT44(local_80.nSeconds,local_80.nBTLimit) / 1000 +
               CONCAT44(local_80.nPatsDyna,local_80.nPatsRand) * 1000000;
    }
    uVar5 = Abc_NtkMiterSat(pNtk,(long)*(int *)((long)pPars + 0x34),0,0,(ABC_INT64_T *)0x0,
                            (ABC_INT64_T *)0x0);
    Abc_NtkMiterPrint(pNtk,"SAT solving",aVar13,*(int *)((long)pPars + 0xc));
    goto LAB_00284d0f;
  }
  if (*(int *)((long)pPars + 0x10) < 1) {
LAB_00284a4f:
    iVar15 = *(int *)((long)pPars + 0xc);
    if (*(int *)((long)pPars + 8) != 0) {
      if (iVar15 != 0) {
        printf("Attempting BDDs with node limit %d ...\n",(ulong)*(uint *)((long)pPars + 0x2c));
        fflush(_stdout);
      }
      iVar15 = clock_gettime(3,(timespec *)&local_80);
      if (iVar15 < 0) {
        aVar13 = -1;
      }
      else {
        aVar13 = CONCAT44(local_80.nSeconds,local_80.nBTLimit) / 1000 +
                 CONCAT44(local_80.nPatsDyna,local_80.nPatsRand) * 1000000;
      }
      uVar5 = 0;
      pAVar7 = Abc_NtkCollapse(pNtk,*(int *)((long)pPars + 0x2c),0,*(int *)((long)pPars + 0x30),0);
      if (pAVar7 != (Abc_Ntk_t *)0x0) {
        Abc_NtkDelete(pNtk);
        if (pAVar7->nObjCounts[7] == 1) {
          if (pAVar7->vPos->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          plVar2 = (long *)*pAVar7->vPos->pArray;
          pDVar3 = *(DdNode **)
                    (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)plVar2[4] * 8) + 0x38);
          pDVar9 = Cudd_ReadLogicZero((DdManager *)pAVar7->pManFunc);
          uVar5 = (uint)(pDVar3 == pDVar9);
        }
        Abc_NtkMiterPrint(pAVar7,"BDD building",aVar13,*(int *)((long)pPars + 0xc));
        pNtk = pAVar7;
        goto LAB_00284ca2;
      }
      Abc_NtkMiterPrint(pNtk,"BDD building",aVar13,*(int *)((long)pPars + 0xc));
      iVar15 = *(int *)((long)pPars + 0xc);
    }
    if (iVar15 != 0) {
      printf("Attempting SAT with conflict limit %d ...\n",(ulong)*(uint *)((long)pPars + 0x34));
      fflush(_stdout);
    }
    iVar15 = clock_gettime(3,(timespec *)&local_80);
    if (iVar15 < 0) {
      aVar13 = -1;
    }
    else {
      aVar13 = CONCAT44(local_80.nSeconds,local_80.nBTLimit) / 1000 +
               CONCAT44(local_80.nPatsDyna,local_80.nPatsRand) * 1000000;
    }
    if (*(long *)((long)pPars + 0x40) == 0) {
      AVar14 = 0;
    }
    else {
      AVar14 = *(long *)((long)pPars + 0x40) - *(long *)((long)pPars + 0x50);
    }
    uVar5 = Abc_NtkMiterSat(pNtk,(long)*(int *)((long)pPars + 0x34),AVar14,0,(ABC_INT64_T *)0x0,
                            (ABC_INT64_T *)0x0);
    Abc_NtkMiterPrint(pNtk,"SAT solving",aVar13,*(int *)((long)pPars + 0xc));
  }
  else {
    iVar15 = 0;
    do {
      dVar18 = (double)iVar15;
      if (*(int *)((long)pPars + 0xc) != 0) {
        iVar4 = *(int *)((long)pPars + 0x14);
        dVar17 = pow((double)*(float *)((long)pPars + 0x18),dVar18);
        iVar1 = *(int *)((long)pPars + 0x24);
        dVar18 = pow((double)*(float *)((long)pPars + 0x28),dVar18);
        printf("ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n",(ulong)(iVar15 + 1),
               (ulong)(uint)(int)(dVar17 * (double)iVar4),(ulong)(uint)(int)(dVar18 * (double)iVar1)
              );
        fflush(_stdout);
      }
      iVar4 = clock_gettime(3,(timespec *)&local_80);
      if (iVar4 < 0) {
        aVar13 = -1;
      }
      else {
        aVar13 = CONCAT44(local_80.nSeconds,local_80.nBTLimit) / 1000 +
                 CONCAT44(local_80.nPatsDyna,local_80.nPatsRand) * 1000000;
      }
      if (*(long *)((long)pPars + 0x40) == 0) {
        AVar14 = 0;
      }
      else {
        AVar14 = *(long *)((long)pPars + 0x40) - *(long *)((long)pPars + 0x50);
      }
      iVar4 = *(int *)((long)pPars + 0x14);
      dVar17 = pow((double)*(float *)((long)pPars + 0x18),dVar18);
      uVar5 = Abc_NtkMiterSat(pNtk,(long)(dVar17 * (double)iVar4),AVar14,0,&local_88,&local_90);
      Abc_NtkMiterPrint(pNtk,"SAT solving",aVar13,*(int *)((long)pPars + 0xc));
      if (-1 < (int)uVar5) goto LAB_00284ca2;
      lVar12 = *(long *)((long)pPars + 0x48) + local_88;
      *(long *)((long)pPars + 0x48) = lVar12;
      lVar6 = *(long *)((long)pPars + 0x50) + local_90;
      *(long *)((long)pPars + 0x50) = lVar6;
      if ((*(long *)((long)pPars + 0x38) <= lVar12 && *(long *)((long)pPars + 0x38) != 0) ||
         (*(long *)((long)pPars + 0x40) <= lVar6 && *(long *)((long)pPars + 0x40) != 0)) {
        puts("Reached global limit on conflicts/inspects. Quitting.");
        uVar5 = 0xffffffff;
        goto LAB_00284d0f;
      }
      pAVar7 = pNtk;
      if (*(int *)((long)pPars + 4) != 0) {
        iVar4 = clock_gettime(3,(timespec *)&local_80);
        if (iVar4 < 0) {
          aVar13 = -1;
        }
        else {
          aVar13 = CONCAT44(local_80.nSeconds,local_80.nBTLimit) / 1000 +
                   CONCAT44(local_80.nPatsDyna,local_80.nPatsRand) * 1000000;
        }
        iVar4 = *(int *)((long)pPars + 0x1c);
        dVar17 = pow((double)*(float *)((long)pPars + 0x20),dVar18);
        iVar4 = -(int)(dVar17 * (double)iVar4);
        while( true ) {
          iVar4 = iVar4 + 3;
          Abc_NtkRewrite(pNtk,0,0,0,0,0);
          uVar5 = Abc_NtkMiterIsConstant(pNtk);
          pAVar7 = pNtk;
          if ((-1 < (int)uVar5) || (iVar4 == 2)) break;
          Abc_NtkRefactor(pNtk,10,0x10,0,0,0,0);
          uVar5 = Abc_NtkMiterIsConstant(pNtk);
          if ((-1 < (int)uVar5) || (iVar4 == 1)) break;
          pAVar7 = Abc_NtkBalance(pNtk,0,0,0);
          Abc_NtkDelete(pNtk);
          uVar5 = Abc_NtkMiterIsConstant(pAVar7);
          if ((-1 < (int)uVar5) || (pNtk = pAVar7, iVar4 == 0)) break;
        }
        Abc_NtkMiterPrint(pAVar7,"Rewriting  ",aVar13,*(int *)((long)pPars + 0xc));
      }
      pNtk = pAVar7;
      if (*pPars != 0) {
        iVar4 = clock_gettime(3,(timespec *)&local_80);
        if (iVar4 < 0) {
          local_98 = -1;
        }
        else {
          local_98 = CONCAT44(local_80.nSeconds,local_80.nBTLimit) / 1000 +
                     CONCAT44(local_80.nPatsDyna,local_80.nPatsRand) * 1000000;
        }
        if (*(long *)((long)pPars + 0x40) == 0) {
          lVar6 = 0;
        }
        else {
          lVar6 = *(long *)((long)pPars + 0x40) - *(long *)((long)pPars + 0x50);
        }
        local_38 = (double)*(int *)((long)pPars + 0x24);
        dVar18 = pow((double)*(float *)((long)pPars + 0x28),dVar18);
        dVar18 = dVar18 * local_38;
        iVar4 = (int)(0x8000000 / (long)(pAVar7->vCis->nSize + pAVar7->nObjCounts[7]));
        if (0x1f < iVar4) {
          iVar4 = 0x20;
        }
        Fraig_ParamsSetDefault(&local_80);
        local_80.nPatsRand = iVar4 << 5;
        local_80.nSeconds = -1;
        local_80.fTryProve = 0;
        local_80.fVerbose = 0;
        local_80.fDoSparse = 1;
        local_80.nPatsDyna = local_80.nPatsRand;
        local_80.nBTLimit = (int)dVar18;
        local_80.nInspLimit = lVar6;
        p = (Fraig_Man_t *)Abc_NtkToFraig(pAVar7,&local_80,0,0);
        Fraig_ManProveMiter(p);
        uVar5 = Fraig_ManCheckMiter(p);
        pNtk = Abc_NtkFromFraig(p,pAVar7);
        if (uVar5 == 0) {
          piVar8 = Fraig_ManReadModel(p);
          if (pNtk->pModel != (int *)0x0) {
            free(pNtk->pModel);
          }
          sVar16 = (long)pNtk->vCis->nSize << 2;
          __dest = (int *)malloc(sVar16);
          pNtk->pModel = __dest;
          memcpy(__dest,piVar8,sVar16);
        }
        Fraig_ManReadSatFails(p);
        iVar4 = Fraig_ManReadConflicts(p);
        local_88 = (long)iVar4;
        iVar4 = Fraig_ManReadInspects(p);
        local_90 = (long)iVar4;
        Fraig_ManFree(p);
        Abc_NtkDelete(pAVar7);
        Abc_NtkMiterPrint(pNtk,"FRAIGing   ",local_98,*(int *)((long)pPars + 0xc));
        if (-1 < (int)uVar5) goto LAB_00284ca2;
        lVar12 = *(long *)((long)pPars + 0x48) + local_88;
        *(long *)((long)pPars + 0x48) = lVar12;
        lVar6 = *(long *)((long)pPars + 0x50) + local_90;
        *(long *)((long)pPars + 0x50) = lVar6;
        if ((*(long *)((long)pPars + 0x38) <= lVar12 && *(long *)((long)pPars + 0x38) != 0) ||
           (*(long *)((long)pPars + 0x40) <= lVar6 && *(long *)((long)pPars + 0x40) != 0)) {
          puts("Reached global limit on conflicts/inspects. Quitting.");
          uVar5 = 0xffffffff;
          goto LAB_00284d0f;
        }
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < *(int *)((long)pPars + 0x10));
    if ((int)uVar5 < 0) goto LAB_00284a4f;
  }
LAB_00284ca2:
  if ((uVar5 == 0) && (pNtk->pModel == (int *)0x0)) {
    sVar16 = (long)pNtk->vCis->nSize << 2;
    piVar8 = (int *)malloc(sVar16);
    pNtk->pModel = piVar8;
    memset(piVar8,0,sVar16);
  }
LAB_00284d0f:
  *local_40 = pNtk;
  return uVar5;
}

Assistant:

int Abc_NtkMiterProve( Abc_Ntk_t ** ppNtk, void * pPars )
{
    Prove_Params_t * pParams = (Prove_Params_t *)pPars;
    Abc_Ntk_t * pNtk, * pNtkTemp;
    int RetValue = -1, nIter, nSatFails, Counter;
    abctime clk; //, timeStart = Abc_Clock();
    ABC_INT64_T nSatConfs, nSatInspects, nInspectLimit;

    // get the starting network
    pNtk = *ppNtk;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
 
    if ( pParams->fVerbose )
    {
        printf( "RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
            pParams->nItersMax, pParams->fUseRewriting? "yes":"no", pParams->fUseFraiging? "yes":"no" );
        printf( "Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n", 
            pParams->nMiteringLimitStart,  pParams->nMiteringLimitMulti, 
            pParams->nRewritingLimitStart, pParams->nRewritingLimitMulti,
            pParams->nFraigingLimitStart,  pParams->nFraigingLimitMulti, pParams->nMiteringLimitLast );
    }

    // if SAT only, solve without iteration
    if ( !pParams->fUseRewriting && !pParams->fUseFraiging )
    {
        clk = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)0, 0, NULL, NULL );
        Abc_NtkMiterPrint( pNtk, "SAT solving", clk, pParams->fVerbose );
        *ppNtk = pNtk;
        return RetValue;
    }

    // check the current resource limits
    for ( nIter = 0; nIter < pParams->nItersMax; nIter++ )
    {
        if ( pParams->fVerbose )
        {
            printf( "ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n", nIter+1, 
                 (int)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)), 
                 (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter)) );
            fflush( stdout );
        }

        // try brute-force SAT
        clk = Abc_Clock();
        nInspectLimit = pParams->nTotalInspectLimit? pParams->nTotalInspectLimit - pParams->nTotalInspectsMade : 0;
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)), (ABC_INT64_T)nInspectLimit, 0, &nSatConfs, &nSatInspects );
        Abc_NtkMiterPrint( pNtk, "SAT solving", clk, pParams->fVerbose );
        if ( RetValue >= 0 )
            break;

        // add to the number of backtracks and inspects
        pParams->nTotalBacktracksMade += nSatConfs;
        pParams->nTotalInspectsMade   += nSatInspects;
        // check if global resource limit is reached
        if ( (pParams->nTotalBacktrackLimit && pParams->nTotalBacktracksMade >= pParams->nTotalBacktrackLimit) ||
             (pParams->nTotalInspectLimit   && pParams->nTotalInspectsMade   >= pParams->nTotalInspectLimit) )
        {
            printf( "Reached global limit on conflicts/inspects. Quitting.\n" );
            *ppNtk = pNtk;
            return -1;
        }

        // try rewriting
        if ( pParams->fUseRewriting )
        {
            clk = Abc_Clock();
            Counter = (int)(pParams->nRewritingLimitStart * pow(pParams->nRewritingLimitMulti,nIter));
//            Counter = 1;
            while ( 1 )
            {
/*
                extern Abc_Ntk_t * Abc_NtkIvyResyn( Abc_Ntk_t * pNtk, int fUpdateLevel, int fVerbose );
                pNtk = Abc_NtkIvyResyn( pNtkTemp = pNtk, 0, 0 );  Abc_NtkDelete( pNtkTemp );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
*/
/*
                Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
*/
                Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
                Abc_NtkRefactor( pNtk, 10, 16, 0, 0, 0, 0 );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
                pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );  Abc_NtkDelete( pNtkTemp );
                if ( (RetValue = Abc_NtkMiterIsConstant(pNtk)) >= 0 )
                    break;
                if ( --Counter == 0 )
                    break;
            }
            Abc_NtkMiterPrint( pNtk, "Rewriting  ", clk, pParams->fVerbose );
        }
 
        if ( pParams->fUseFraiging )
        {
            // try FRAIGing
            clk = Abc_Clock();
            nInspectLimit = pParams->nTotalInspectLimit? pParams->nTotalInspectLimit - pParams->nTotalInspectsMade : 0;
            pNtk = Abc_NtkMiterFraig( pNtkTemp = pNtk, (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter)), nInspectLimit, &RetValue, &nSatFails, &nSatConfs, &nSatInspects );  Abc_NtkDelete( pNtkTemp );
            Abc_NtkMiterPrint( pNtk, "FRAIGing   ", clk, pParams->fVerbose );
//            printf( "NumFails = %d\n", nSatFails );
            if ( RetValue >= 0 )
                break;

            // add to the number of backtracks and inspects
            pParams->nTotalBacktracksMade += nSatConfs;
            pParams->nTotalInspectsMade += nSatInspects;
            // check if global resource limit is reached
            if ( (pParams->nTotalBacktrackLimit && pParams->nTotalBacktracksMade >= pParams->nTotalBacktrackLimit) ||
                 (pParams->nTotalInspectLimit   && pParams->nTotalInspectsMade   >= pParams->nTotalInspectLimit) )
            {
                printf( "Reached global limit on conflicts/inspects. Quitting.\n" );
                *ppNtk = pNtk;
                return -1;
            }
        }

    }    

    // try to prove it using brute force SAT
#ifdef ABC_USE_CUDD
    if ( RetValue < 0 && pParams->fUseBdds )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting BDDs with node limit %d ...\n", pParams->nBddSizeLimit );
            fflush( stdout );
        }
        clk = Abc_Clock();
        pNtk = Abc_NtkCollapse( pNtkTemp = pNtk, pParams->nBddSizeLimit, 0, pParams->fBddReorder, 0 );
        if ( pNtk )   
        {
            Abc_NtkDelete( pNtkTemp );
            RetValue = ( (Abc_NtkNodeNum(pNtk) == 1) && (Abc_ObjFanin0(Abc_NtkPo(pNtk,0))->pData == Cudd_ReadLogicZero((DdManager *)pNtk->pManFunc)) );
        }
        else 
            pNtk = pNtkTemp;
        Abc_NtkMiterPrint( pNtk, "BDD building", clk, pParams->fVerbose );
    }
#endif

    if ( RetValue < 0 )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting SAT with conflict limit %d ...\n", pParams->nMiteringLimitLast );
            fflush( stdout );
        }
        clk = Abc_Clock();
        nInspectLimit = pParams->nTotalInspectLimit? pParams->nTotalInspectLimit - pParams->nTotalInspectsMade : 0;
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)nInspectLimit, 0, NULL, NULL );
        Abc_NtkMiterPrint( pNtk, "SAT solving", clk, pParams->fVerbose );
    }

    // assign the model if it was proved by rewriting (const 1 miter)
    if ( RetValue == 0 && pNtk->pModel == NULL )
    {
        pNtk->pModel = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
        memset( pNtk->pModel, 0, sizeof(int) * Abc_NtkCiNum(pNtk) );
    }
    *ppNtk = pNtk;
    return RetValue;
}